

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.h
# Opt level: O1

shared_ptr<mocker::ir::Reg>
mocker::ir::detail::dyc_impl<mocker::ir::Reg,std::shared_ptr<mocker::ir::Addr>const&>
          (shared_ptr<mocker::ir::Addr> *v,Reg *param_2)

{
  _func_int **pp_Var1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  undefined1 auVar4 [16];
  shared_ptr<mocker::ir::Reg> sVar5;
  
  pp_Var1 = (param_2->super_Addr)._vptr_Addr;
  if (pp_Var1 == (_func_int **)0x0) {
    peVar3 = (element_type *)0x0;
  }
  else {
    auVar4 = __dynamic_cast(pp_Var1,&Addr::typeinfo,&Reg::typeinfo,0);
    in_RDX._M_pi = auVar4._8_8_;
    peVar3 = auVar4._0_8_;
  }
  if (peVar3 == (element_type *)0x0) {
    (v->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
         (element_type *)0x0;
    (v->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    (v->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar3;
    p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(param_2->identifier)._M_dataplus._M_p;
    (v->super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var2
    ;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
  }
  sVar5.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar5.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)v;
  return (shared_ptr<mocker::ir::Reg>)
         sVar5.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<T> dyc_impl(V &&v, T *) {
  return std::dynamic_pointer_cast<T>(v);
}